

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O1

S2Cap * __thiscall
S2MinDistanceEdgeTarget::GetCapBound(S2Cap *__return_storage_ptr__,S2MinDistanceEdgeTarget *this)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double length2;
  double local_28;
  ostream *local_20;
  
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_28,&this->a_,&this->b_);
  dVar2 = local_28 * -0.25 + 1.0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  length2 = (local_28 * 0.5) / (dVar2 + 1.0);
  dVar2 = (this->a_).c_[0] + (this->b_).c_[0];
  dVar4 = (this->a_).c_[1] + (this->b_).c_[1];
  dVar5 = (this->a_).c_[2] + (this->b_).c_[2];
  dVar3 = dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar3 = (double)(~-(ulong)(dVar3 != 0.0) & (ulong)dVar3 |
                  (ulong)(1.0 / dVar3) & -(ulong)(dVar3 != 0.0));
  if (4.0 <= length2) {
    length2 = 4.0;
  }
  S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,length2);
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
  (__return_storage_ptr__->center_).c_[0] = dVar2 * dVar3;
  (__return_storage_ptr__->center_).c_[1] = dVar4 * dVar3;
  (__return_storage_ptr__->center_).c_[2] = dVar5 * dVar3;
  bVar1 = S2::IsUnitLength(&__return_storage_ptr__->center_);
  if ((bVar1) && ((__return_storage_ptr__->radius_).length2_ <= 4.0)) {
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
             ,0xf5,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(local_20,"Check failed: is_valid() ",0x19);
  abort();
}

Assistant:

S2Cap S2MinDistanceEdgeTarget::GetCapBound() {
  // The following computes a radius equal to half the edge length in an
  // efficient and numerically stable way.
  double d2 = S1ChordAngle(a_, b_).length2();
  double r2 = (0.5 * d2) / (1 + sqrt(1 - 0.25 * d2));
  return S2Cap((a_ + b_).Normalize(), S1ChordAngle::FromLength2(r2));
}